

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_block_elim_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::LocalSingleBlockLoadStoreElimPass::InitExtensions
          (LocalSingleBlockLoadStoreElimPass *this)

{
  long lVar1;
  allocator<char> local_850;
  allocator<char> local_84f;
  allocator<char> local_84e;
  allocator<char> local_84d;
  allocator<char> local_84c;
  allocator<char> local_84b;
  allocator<char> local_84a;
  allocator<char> local_849;
  allocator<char> local_848;
  allocator<char> local_847;
  allocator<char> local_846;
  allocator<char> local_845;
  allocator<char> local_844;
  allocator<char> local_843;
  allocator<char> local_842;
  allocator<char> local_841;
  allocator<char> local_840;
  allocator<char> local_83f;
  allocator<char> local_83e;
  allocator<char> local_83d;
  allocator<char> local_83c;
  allocator<char> local_83b;
  allocator<char> local_83a;
  allocator<char> local_839;
  allocator<char> local_838;
  allocator<char> local_837;
  allocator<char> local_836;
  allocator<char> local_835;
  allocator<char> local_834;
  allocator<char> local_833;
  allocator<char> local_832;
  allocator<char> local_831;
  allocator<char> local_830;
  allocator<char> local_82f;
  allocator<char> local_82e;
  allocator<char> local_82d;
  allocator<char> local_82c;
  allocator<char> local_82b;
  allocator<char> local_82a;
  allocator<char> local_829;
  allocator<char> local_828;
  allocator<char> local_827;
  allocator<char> local_826;
  allocator<char> local_825;
  allocator<char> local_824;
  allocator<char> local_823;
  allocator<char> local_822;
  allocator<char> local_821;
  allocator<char> local_820;
  allocator<char> local_81f;
  allocator<char> local_81e;
  allocator<char> local_81d;
  allocator<char> local_81c;
  allocator<char> local_81b;
  allocator<char> local_81a;
  allocator<char> local_819;
  allocator<char> local_818;
  allocator<char> local_817;
  allocator<char> local_816;
  allocator<char> local_815;
  allocator<char> local_814;
  allocator<char> local_813;
  allocator<char> local_812;
  allocator<char> local_811;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(this->extensions_allowlist_)._M_h);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_810,"SPV_AMD_shader_explicit_vertex_parameter",&local_811);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7f0,"SPV_AMD_shader_trinary_minmax",&local_812);
  std::__cxx11::string::string<std::allocator<char>>(local_7d0,"SPV_AMD_gcn_shader",&local_813);
  std::__cxx11::string::string<std::allocator<char>>(local_7b0,"SPV_KHR_shader_ballot",&local_814);
  std::__cxx11::string::string<std::allocator<char>>(local_790,"SPV_AMD_shader_ballot",&local_815);
  std::__cxx11::string::string<std::allocator<char>>(local_770,"SPV_AMDX_shader_enqueue",&local_816)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_750,"SPV_AMD_gpu_shader_half_float",&local_817);
  std::__cxx11::string::string<std::allocator<char>>
            (local_730,"SPV_KHR_shader_draw_parameters",&local_818);
  std::__cxx11::string::string<std::allocator<char>>(local_710,"SPV_KHR_subgroup_vote",&local_819);
  std::__cxx11::string::string<std::allocator<char>>(local_6f0,"SPV_KHR_8bit_storage",&local_81a);
  std::__cxx11::string::string<std::allocator<char>>(local_6d0,"SPV_KHR_16bit_storage",&local_81b);
  std::__cxx11::string::string<std::allocator<char>>(local_6b0,"SPV_KHR_device_group",&local_81c);
  std::__cxx11::string::string<std::allocator<char>>(local_690,"SPV_KHR_multiview",&local_81d);
  std::__cxx11::string::string<std::allocator<char>>
            (local_670,"SPV_NVX_multiview_per_view_attributes",&local_81e);
  std::__cxx11::string::string<std::allocator<char>>(local_650,"SPV_NV_viewport_array2",&local_81f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_630,"SPV_NV_stereo_view_rendering",&local_820);
  std::__cxx11::string::string<std::allocator<char>>
            (local_610,"SPV_NV_sample_mask_override_coverage",&local_821);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5f0,"SPV_NV_geometry_shader_passthrough",&local_822);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5d0,"SPV_AMD_texture_gather_bias_lod",&local_823);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5b0,"SPV_KHR_storage_buffer_storage_class",&local_824);
  std::__cxx11::string::string<std::allocator<char>>
            (local_590,"SPV_KHR_variable_pointers",&local_825);
  std::__cxx11::string::string<std::allocator<char>>
            (local_570,"SPV_AMD_gpu_shader_int16",&local_826);
  std::__cxx11::string::string<std::allocator<char>>
            (local_550,"SPV_KHR_post_depth_coverage",&local_827);
  std::__cxx11::string::string<std::allocator<char>>
            (local_530,"SPV_KHR_shader_atomic_counter_ops",&local_828);
  std::__cxx11::string::string<std::allocator<char>>
            (local_510,"SPV_EXT_shader_stencil_export",&local_829);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4f0,"SPV_EXT_shader_viewport_index_layer",&local_82a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4d0,"SPV_AMD_shader_image_load_store_lod",&local_82b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4b0,"SPV_AMD_shader_fragment_mask",&local_82c);
  std::__cxx11::string::string<std::allocator<char>>
            (local_490,"SPV_EXT_fragment_fully_covered",&local_82d);
  std::__cxx11::string::string<std::allocator<char>>
            (local_470,"SPV_AMD_gpu_shader_half_float_fetch",&local_82e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_450,"SPV_GOOGLE_decorate_string",&local_82f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_430,"SPV_GOOGLE_hlsl_functionality1",&local_830);
  std::__cxx11::string::string<std::allocator<char>>(local_410,"SPV_GOOGLE_user_type",&local_831);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3f0,"SPV_NV_shader_subgroup_partitioned",&local_832);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3d0,"SPV_EXT_demote_to_helper_invocation",&local_833);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3b0,"SPV_EXT_descriptor_indexing",&local_834);
  std::__cxx11::string::string<std::allocator<char>>
            (local_390,"SPV_NV_fragment_shader_barycentric",&local_835);
  std::__cxx11::string::string<std::allocator<char>>
            (local_370,"SPV_NV_compute_shader_derivatives",&local_836);
  std::__cxx11::string::string<std::allocator<char>>
            (local_350,"SPV_NV_shader_image_footprint",&local_837);
  std::__cxx11::string::string<std::allocator<char>>(local_330,"SPV_NV_shading_rate",&local_838);
  std::__cxx11::string::string<std::allocator<char>>(local_310,"SPV_NV_mesh_shader",&local_839);
  std::__cxx11::string::string<std::allocator<char>>(local_2f0,"SPV_EXT_mesh_shader",&local_83a);
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"SPV_NV_ray_tracing",&local_83b);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"SPV_KHR_ray_tracing",&local_83c);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"SPV_KHR_ray_query",&local_83d);
  std::__cxx11::string::string<std::allocator<char>>
            (local_270,"SPV_EXT_fragment_invocation_density",&local_83e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_250,"SPV_EXT_physical_storage_buffer",&local_83f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_230,"SPV_KHR_physical_storage_buffer",&local_840);
  std::__cxx11::string::string<std::allocator<char>>
            (local_210,"SPV_KHR_terminate_invocation",&local_841);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f0,"SPV_KHR_subgroup_uniform_control_flow",&local_842);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d0,"SPV_KHR_integer_dot_product",&local_843);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b0,"SPV_EXT_shader_image_int64",&local_844);
  std::__cxx11::string::string<std::allocator<char>>
            (local_190,"SPV_KHR_non_semantic_info",&local_845);
  std::__cxx11::string::string<std::allocator<char>>
            (local_170,"SPV_KHR_uniform_group_instructions",&local_846);
  std::__cxx11::string::string<std::allocator<char>>
            (local_150,"SPV_KHR_fragment_shader_barycentric",&local_847);
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"SPV_KHR_vulkan_memory_model",&local_848);
  std::__cxx11::string::string<std::allocator<char>>(local_110,"SPV_NV_bindless_texture",&local_849)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_f0,"SPV_EXT_shader_atomic_float_add",&local_84a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,"SPV_EXT_fragment_shader_interlock",&local_84b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"SPV_KHR_compute_shader_derivatives",&local_84c);
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,"SPV_NV_cooperative_matrix",&local_84d);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"SPV_KHR_cooperative_matrix",&local_84e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"SPV_KHR_ray_tracing_position_fetch",&local_84f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"SPV_KHR_fragment_shading_rate",&local_850);
  std::__detail::
  _Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::insert<std::__cxx11::string_const*>
            ((_Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->extensions_allowlist_,&local_810,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff0);
  lVar1 = 0x7e0;
  do {
    std::__cxx11::string::_M_dispose();
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

void LocalSingleBlockLoadStoreElimPass::InitExtensions() {
  extensions_allowlist_.clear();
  extensions_allowlist_.insert({"SPV_AMD_shader_explicit_vertex_parameter",
                                "SPV_AMD_shader_trinary_minmax",
                                "SPV_AMD_gcn_shader",
                                "SPV_KHR_shader_ballot",
                                "SPV_AMD_shader_ballot",
                                "SPV_AMDX_shader_enqueue",
                                "SPV_AMD_gpu_shader_half_float",
                                "SPV_KHR_shader_draw_parameters",
                                "SPV_KHR_subgroup_vote",
                                "SPV_KHR_8bit_storage",
                                "SPV_KHR_16bit_storage",
                                "SPV_KHR_device_group",
                                "SPV_KHR_multiview",
                                "SPV_NVX_multiview_per_view_attributes",
                                "SPV_NV_viewport_array2",
                                "SPV_NV_stereo_view_rendering",
                                "SPV_NV_sample_mask_override_coverage",
                                "SPV_NV_geometry_shader_passthrough",
                                "SPV_AMD_texture_gather_bias_lod",
                                "SPV_KHR_storage_buffer_storage_class",
                                "SPV_KHR_variable_pointers",
                                "SPV_AMD_gpu_shader_int16",
                                "SPV_KHR_post_depth_coverage",
                                "SPV_KHR_shader_atomic_counter_ops",
                                "SPV_EXT_shader_stencil_export",
                                "SPV_EXT_shader_viewport_index_layer",
                                "SPV_AMD_shader_image_load_store_lod",
                                "SPV_AMD_shader_fragment_mask",
                                "SPV_EXT_fragment_fully_covered",
                                "SPV_AMD_gpu_shader_half_float_fetch",
                                "SPV_GOOGLE_decorate_string",
                                "SPV_GOOGLE_hlsl_functionality1",
                                "SPV_GOOGLE_user_type",
                                "SPV_NV_shader_subgroup_partitioned",
                                "SPV_EXT_demote_to_helper_invocation",
                                "SPV_EXT_descriptor_indexing",
                                "SPV_NV_fragment_shader_barycentric",
                                "SPV_NV_compute_shader_derivatives",
                                "SPV_NV_shader_image_footprint",
                                "SPV_NV_shading_rate",
                                "SPV_NV_mesh_shader",
                                "SPV_EXT_mesh_shader",
                                "SPV_NV_ray_tracing",
                                "SPV_KHR_ray_tracing",
                                "SPV_KHR_ray_query",
                                "SPV_EXT_fragment_invocation_density",
                                "SPV_EXT_physical_storage_buffer",
                                "SPV_KHR_physical_storage_buffer",
                                "SPV_KHR_terminate_invocation",
                                "SPV_KHR_subgroup_uniform_control_flow",
                                "SPV_KHR_integer_dot_product",
                                "SPV_EXT_shader_image_int64",
                                "SPV_KHR_non_semantic_info",
                                "SPV_KHR_uniform_group_instructions",
                                "SPV_KHR_fragment_shader_barycentric",
                                "SPV_KHR_vulkan_memory_model",
                                "SPV_NV_bindless_texture",
                                "SPV_EXT_shader_atomic_float_add",
                                "SPV_EXT_fragment_shader_interlock",
                                "SPV_KHR_compute_shader_derivatives",
                                "SPV_NV_cooperative_matrix",
                                "SPV_KHR_cooperative_matrix",
                                "SPV_KHR_ray_tracing_position_fetch",
                                "SPV_KHR_fragment_shading_rate"});
}